

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_bitfield_insert_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,uint32_t op3,char *op,BaseType offset_count_type)

{
  BaseType BVar1;
  bool bVar2;
  SPIRType *pSVar3;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  char (*ts_9) [2];
  string local_240;
  string local_220;
  string op3_expr;
  string op2_expr;
  string op1_expr;
  string op0_expr;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,op2);
  bVar2 = should_forward(this,op0);
  if (bVar2) {
    bVar2 = should_forward(this,op1);
    if (bVar2) {
      bVar2 = should_forward(this,op2);
      if (bVar2) {
        bVar2 = should_forward(this,op3);
        goto LAB_002e3a84;
      }
    }
  }
  bVar2 = false;
LAB_002e3a84:
  to_unpacked_expression_abi_cxx11_(&op0_expr,this,op0,true);
  to_unpacked_expression_abi_cxx11_(&op1_expr,this,op1,true);
  to_unpacked_expression_abi_cxx11_(&op2_expr,this,op2,true);
  to_unpacked_expression_abi_cxx11_(&op3_expr,this,op3,true);
  BVar1 = offset_count_type;
  if (offset_count_type - Int < 2) {
    local_180._32_8_ = local_180 + 0x38;
    local_180._8_4_ = 0;
    local_180._0_8_ = &PTR__SPIRType_004e8f68;
    local_180._12_4_ = 0x15;
    local_180._28_4_ = 1;
    local_180._40_8_ = 0;
    local_180._48_8_ = 8;
    local_180._88_8_ = local_180 + 0x70;
    local_180._96_8_ = 0;
    local_180._104_8_ = 8;
    local_180._120_4_ = 0;
    local_180[0x7c] = false;
    local_180[0x7d] = false;
    local_180._128_4_ = Generic;
    local_180._136_8_ = local_180 + 0xa0;
    local_180._144_8_ = 0;
    local_180._152_8_ = 8;
    local_c0 = local_a8;
    local_b8 = 0;
    local_b0 = 8;
    local_68 = &p_Stack_38;
    local_88._0_7_ = 0;
    local_88._7_4_ = 0;
    local_88._12_4_ = 0;
    local_88._16_4_ = ImageFormatUnknown;
    local_88._20_4_ = AccessQualifierReadOnly;
    local_88._24_4_ = 0;
    local_6c.id = 0;
    local_60 = 1;
    local_58._M_nxt = (_Hash_node_base *)0x0;
    sStack_50 = 0;
    local_48 = 1.0;
    local_40 = 0;
    p_Stack_38 = (__node_base_ptr)0x0;
    local_180._20_4_ = 0x20;
    local_180._24_4_ = 1;
    local_180._16_4_ = offset_count_type;
    pSVar3 = Compiler::expression_type(&this->super_Compiler,op2);
    if (pSVar3->basetype != BVar1) {
      type_to_glsl_constructor_abi_cxx11_(&local_240,this,(SPIRType *)local_180);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_220,(spirv_cross *)&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e911,
                 (char (*) [2])&op2_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,ts_3)
      ;
      ::std::__cxx11::string::operator=((string *)&op2_expr,(string *)&local_220);
      ::std::__cxx11::string::~string((string *)&local_220);
      ::std::__cxx11::string::~string((string *)&local_240);
    }
    ts_9 = (char (*) [2])0x2e3c3f;
    pSVar3 = Compiler::expression_type(&this->super_Compiler,op3);
    if (pSVar3->basetype != BVar1) {
      type_to_glsl_constructor_abi_cxx11_(&local_240,this,(SPIRType *)local_180);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_220,(spirv_cross *)&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e911,
                 (char (*) [2])&op3_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,ts_3)
      ;
      ::std::__cxx11::string::operator=((string *)&op3_expr,(string *)&local_220);
      ::std::__cxx11::string::~string((string *)&local_220);
      ts_9 = (char (*) [2])0x2e3ca0;
      ::std::__cxx11::string::~string((string *)&local_240);
    }
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_220,(spirv_cross *)&op,(char **)0x39e911,(char (*) [2])&op0_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39b375,
               (char (*) [3])&op1_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39b375,
               (char (*) [3])&op2_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39b375,
               (char (*) [3])&op3_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,ts_9);
    emit_op(this,result_type,result_id,&local_220,bVar2,false);
    ::std::__cxx11::string::~string((string *)&local_220);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op3);
    SPIRType::~SPIRType((SPIRType *)local_180);
    ::std::__cxx11::string::~string((string *)&op3_expr);
    ::std::__cxx11::string::~string((string *)&op2_expr);
    ::std::__cxx11::string::~string((string *)&op1_expr);
    ::std::__cxx11::string::~string((string *)&op0_expr);
    return;
  }
  __assert_fail("offset_count_type == SPIRType::UInt || offset_count_type == SPIRType::Int",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                ,0x1c40,
                "void spirv_cross::CompilerGLSL::emit_bitfield_insert_op(uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, const char *, SPIRType::BaseType)"
               );
}

Assistant:

void CompilerGLSL::emit_bitfield_insert_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                           uint32_t op2, uint32_t op3, const char *op,
                                           SPIRType::BaseType offset_count_type)
{
	// Only need to cast offset/count arguments. Types of base/insert must be same as result type,
	// and bitfieldInsert is sign invariant.
	bool forward = should_forward(op0) && should_forward(op1) && should_forward(op2) && should_forward(op3);

	auto op0_expr = to_unpacked_expression(op0);
	auto op1_expr = to_unpacked_expression(op1);
	auto op2_expr = to_unpacked_expression(op2);
	auto op3_expr = to_unpacked_expression(op3);

	assert(offset_count_type == SPIRType::UInt || offset_count_type == SPIRType::Int);
	SPIRType target_type { OpTypeInt };
	target_type.width = 32;
	target_type.vecsize = 1;
	target_type.basetype = offset_count_type;

	if (expression_type(op2).basetype != offset_count_type)
	{
		// Value-cast here. Input might be 16-bit. GLSL requires int.
		op2_expr = join(type_to_glsl_constructor(target_type), "(", op2_expr, ")");
	}

	if (expression_type(op3).basetype != offset_count_type)
	{
		// Value-cast here. Input might be 16-bit. GLSL requires int.
		op3_expr = join(type_to_glsl_constructor(target_type), "(", op3_expr, ")");
	}

	emit_op(result_type, result_id, join(op, "(", op0_expr, ", ", op1_expr, ", ", op2_expr, ", ", op3_expr, ")"),
	        forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
	inherit_expression_dependencies(result_id, op3);
}